

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_list(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlListPtr pxVar6;
  xmlListPtr pxVar7;
  xmlListPtr pxVar8;
  int test_ret_4;
  int *in_RSI;
  int test_ret_3;
  bool bVar9;
  int n_l;
  uint uVar10;
  int test_ret_2;
  int test_ret_1;
  int local_70;
  int test_ret;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing list : 19 of 26 functions ...");
  }
  bVar9 = true;
  iVar3 = 0;
  while (bVar9) {
    iVar1 = xmlMemBlocks();
    xmlLinkGetData(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar9 = false;
    printf("Leak of %d blocks found in xmlLinkGetData");
    in_RSI = (int *)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
    pxVar7 = (xmlListPtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar7;
      if (iVar2 == 3) break;
      iVar4 = xmlMemBlocks();
      pxVar6 = gen_xmlListPtr(uVar10,iVar1);
      in_RSI = &call_tests;
      if (iVar2 != 0) {
        if (iVar2 == 1) {
          in_RSI = (int *)0xffffffffffffffff;
        }
        else {
          in_RSI = (int *)0x0;
        }
      }
      xmlListAppend(pxVar6);
      call_tests = call_tests + 1;
      if (pxVar6 != (xmlListPtr)0x0) {
        xmlListDelete(pxVar6);
      }
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar4 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListAppend",(ulong)(uint)(iVar1 - iVar4));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar7;
      }
      pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
    iVar1 = xmlMemBlocks();
    pxVar7 = gen_xmlListPtr(uVar10,(int)in_RSI);
    xmlListClear(pxVar7);
    call_tests = call_tests + 1;
    if (pxVar7 != (xmlListPtr)0x0) {
      xmlListDelete(pxVar7);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListClear",(ulong)(uint)(iVar2 - iVar1));
      local_68 = local_68 + 1;
      in_RSI = (int *)(ulong)uVar10;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  local_64 = 0;
  do {
    if (iVar1 == 2) {
      function_tests = function_tests + 1;
      test_ret = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        iVar1 = xmlMemBlocks();
        pxVar7 = gen_xmlListPtr(uVar10,(int)in_RSI);
        xmlListEmpty(pxVar7);
        call_tests = call_tests + 1;
        if (pxVar7 != (xmlListPtr)0x0) {
          xmlListDelete(pxVar7);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlListEmpty",(ulong)(uint)(iVar2 - iVar1));
          test_ret = test_ret + 1;
          in_RSI = (int *)(ulong)uVar10;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_40 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 3) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          in_RSI = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              in_RSI = (int *)0xffffffffffffffff;
            }
            else {
              in_RSI = (int *)0x0;
            }
          }
          xmlListInsert(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListInsert",(ulong)(uint)(iVar1 - iVar4));
            local_40 = local_40 + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_44 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 2) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          pxVar8 = gen_xmlListPtr(iVar2,iVar1);
          in_RSI = (int *)pxVar8;
          xmlListMerge(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          if (pxVar8 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar8);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListMerge",(ulong)(uint)(iVar1 - iVar4));
            local_44 = local_44 + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_70 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        iVar1 = xmlMemBlocks();
        pxVar7 = gen_xmlListPtr(uVar10,(int)in_RSI);
        xmlListPopBack(pxVar7);
        call_tests = call_tests + 1;
        if (pxVar7 != (xmlListPtr)0x0) {
          xmlListDelete(pxVar7);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlListPopBack",(ulong)(uint)(iVar2 - iVar1));
          local_70 = local_70 + 1;
          in_RSI = (int *)(ulong)uVar10;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      test_ret_1 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        iVar1 = xmlMemBlocks();
        pxVar7 = gen_xmlListPtr(uVar10,(int)in_RSI);
        xmlListPopFront(pxVar7);
        call_tests = call_tests + 1;
        if (pxVar7 != (xmlListPtr)0x0) {
          xmlListDelete(pxVar7);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlListPopFront",(ulong)(uint)(iVar2 - iVar1));
          test_ret_1 = test_ret_1 + 1;
          in_RSI = (int *)(ulong)uVar10;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_48 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 3) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          in_RSI = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              in_RSI = (int *)0xffffffffffffffff;
            }
            else {
              in_RSI = (int *)0x0;
            }
          }
          xmlListPushBack(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListPushBack",(ulong)(uint)(iVar1 - iVar4));
            local_48 = local_48 + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_4c = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 3) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          in_RSI = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              in_RSI = (int *)0xffffffffffffffff;
            }
            else {
              in_RSI = (int *)0x0;
            }
          }
          xmlListPushFront(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListPushFront",(ulong)(uint)(iVar1 - iVar4));
            local_4c = local_4c + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_50 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 3) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          in_RSI = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              in_RSI = (int *)0xffffffffffffffff;
            }
            else {
              in_RSI = (int *)0x0;
            }
          }
          xmlListRemoveAll(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListRemoveAll",(ulong)(uint)(iVar1 - iVar4));
            local_50 = local_50 + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_54 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 3) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          in_RSI = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              in_RSI = (int *)0xffffffffffffffff;
            }
            else {
              in_RSI = (int *)0x0;
            }
          }
          xmlListRemoveFirst(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListRemoveFirst",(ulong)(uint)(iVar1 - iVar4));
            local_54 = local_54 + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_58 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 3) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          in_RSI = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              in_RSI = (int *)0xffffffffffffffff;
            }
            else {
              in_RSI = (int *)0x0;
            }
          }
          xmlListRemoveLast(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListRemoveLast",(ulong)(uint)(iVar1 - iVar4));
            local_58 = local_58 + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      test_ret_2 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        iVar1 = xmlMemBlocks();
        pxVar7 = gen_xmlListPtr(uVar10,(int)in_RSI);
        xmlListReverse(pxVar7);
        call_tests = call_tests + 1;
        if (pxVar7 != (xmlListPtr)0x0) {
          xmlListDelete(pxVar7);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlListReverse",(ulong)(uint)(iVar2 - iVar1));
          test_ret_2 = test_ret_2 + 1;
          in_RSI = (int *)(ulong)uVar10;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_5c = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 3) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          in_RSI = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              in_RSI = (int *)0xffffffffffffffff;
            }
            else {
              in_RSI = (int *)0x0;
            }
          }
          xmlListReverseSearch(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListReverseSearch",(ulong)(uint)(iVar1 - iVar4));
            local_5c = local_5c + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_60 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pxVar7 = (xmlListPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar7;
          if (iVar2 == 3) break;
          iVar4 = xmlMemBlocks();
          pxVar6 = gen_xmlListPtr(uVar10,iVar1);
          in_RSI = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              in_RSI = (int *)0xffffffffffffffff;
            }
            else {
              in_RSI = (int *)0x0;
            }
          }
          xmlListSearch(pxVar6);
          call_tests = call_tests + 1;
          if (pxVar6 != (xmlListPtr)0x0) {
            xmlListDelete(pxVar6);
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar4 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlListSearch",(ulong)(uint)(iVar1 - iVar4));
            local_60 = local_60 + 1;
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar7;
          }
          pxVar7 = (xmlListPtr)(ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      iVar1 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        iVar2 = xmlMemBlocks();
        pxVar7 = gen_xmlListPtr(uVar10,(int)in_RSI);
        xmlListSize(pxVar7);
        call_tests = call_tests + 1;
        if (pxVar7 != (xmlListPtr)0x0) {
          xmlListDelete(pxVar7);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar2 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlListSize",(ulong)(uint)(iVar4 - iVar2));
          iVar1 = iVar1 + 1;
          in_RSI = (int *)(ulong)uVar10;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      iVar2 = 0;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        iVar4 = xmlMemBlocks();
        pxVar7 = gen_xmlListPtr(uVar10,(int)in_RSI);
        xmlListSort(pxVar7);
        call_tests = call_tests + 1;
        if (pxVar7 != (xmlListPtr)0x0) {
          xmlListDelete(pxVar7);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlListSort",(ulong)(uint)(iVar5 - iVar4));
          iVar2 = iVar2 + 1;
          in_RSI = (int *)(ulong)uVar10;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      iVar1 = iVar1 + iVar2 +
              local_54 + local_58 + test_ret_2 + local_5c + local_60 +
              test_ret_1 + local_48 + local_4c + local_50 +
              local_40 + local_44 + local_70 + local_64 + test_ret + local_3c + local_68;
      uVar10 = -(iVar3 - iVar1);
      if (iVar3 != iVar1) {
        printf("Module list: %d errors\n",(ulong)uVar10);
      }
      return uVar10;
    }
    bVar9 = true;
    while (iVar2 = (int)in_RSI, bVar9) {
      iVar4 = xmlMemBlocks();
      pxVar7 = gen_xmlListPtr(iVar1,iVar2);
      in_RSI = (int *)0x0;
      xmlListCopy(pxVar7);
      call_tests = call_tests + 1;
      if (pxVar7 != (xmlListPtr)0x0) {
        xmlListDelete(pxVar7);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 == iVar2) break;
      iVar2 = xmlMemBlocks();
      bVar9 = false;
      printf("Leak of %d blocks found in xmlListCopy",(ulong)(uint)(iVar2 - iVar4));
      local_64 = local_64 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

static int
test_list(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing list : 19 of 26 functions ...\n");
    test_ret += test_xmlLinkGetData();
    test_ret += test_xmlListAppend();
    test_ret += test_xmlListClear();
    test_ret += test_xmlListCopy();
    test_ret += test_xmlListCreate();
    test_ret += test_xmlListDup();
    test_ret += test_xmlListEmpty();
    test_ret += test_xmlListEnd();
    test_ret += test_xmlListFront();
    test_ret += test_xmlListInsert();
    test_ret += test_xmlListMerge();
    test_ret += test_xmlListPopBack();
    test_ret += test_xmlListPopFront();
    test_ret += test_xmlListPushBack();
    test_ret += test_xmlListPushFront();
    test_ret += test_xmlListRemoveAll();
    test_ret += test_xmlListRemoveFirst();
    test_ret += test_xmlListRemoveLast();
    test_ret += test_xmlListReverse();
    test_ret += test_xmlListReverseSearch();
    test_ret += test_xmlListReverseWalk();
    test_ret += test_xmlListSearch();
    test_ret += test_xmlListSize();
    test_ret += test_xmlListSort();
    test_ret += test_xmlListWalk();

    if (test_ret != 0)
	printf("Module list: %d errors\n", test_ret);
    return(test_ret);
}